

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaVirtualBlock_T::VmaVirtualBlock_T(VmaVirtualBlock_T *this,VmaVirtualBlockCreateInfo *createInfo)

{
  VkAllocationCallbacks *pVVar1;
  void *pvVar2;
  PFN_vkAllocationFunction p_Var3;
  PFN_vkReallocationFunction p_Var4;
  PFN_vkFreeFunction p_Var5;
  PFN_vkInternalFreeNotification p_Var6;
  VmaBlockMetadata *pVVar7;
  VkAllocationCallbacks *pVVar8;
  VkAllocationCallbacks *pAllocationCallbacks;
  bool bVar9;
  
  pVVar1 = createInfo->pAllocationCallbacks;
  pAllocationCallbacks = &this->m_AllocationCallbacks;
  bVar9 = pVVar1 != (VkAllocationCallbacks *)0x0;
  this->m_AllocationCallbacksSpecified = bVar9;
  pVVar8 = &VmaEmptyAllocationCallbacks;
  if (bVar9) {
    pVVar8 = pVVar1;
  }
  pvVar2 = pVVar8->pUserData;
  p_Var3 = pVVar8->pfnAllocation;
  p_Var4 = pVVar8->pfnReallocation;
  p_Var5 = pVVar8->pfnFree;
  p_Var6 = pVVar8->pfnInternalFree;
  (this->m_AllocationCallbacks).pfnInternalAllocation = pVVar8->pfnInternalAllocation;
  (this->m_AllocationCallbacks).pfnInternalFree = p_Var6;
  (this->m_AllocationCallbacks).pfnReallocation = p_Var4;
  (this->m_AllocationCallbacks).pfnFree = p_Var5;
  (this->m_AllocationCallbacks).pUserData = pvVar2;
  (this->m_AllocationCallbacks).pfnAllocation = p_Var3;
  if (!bVar9) {
    pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
  }
  if ((createInfo->flags & 1) == 0) {
    pVVar7 = (VmaBlockMetadata *)VmaMalloc(pAllocationCallbacks,400,8);
    pVVar7->m_Size = 0;
    pVVar7->m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    pVVar7->m_BufferImageGranularity = 1;
    pVVar7->m_IsVirtual = true;
    pVVar7->_vptr_VmaBlockMetadata = (_func_int **)&PTR__VmaBlockMetadata_TLSF_00330000;
    *(undefined4 *)&pVVar7[7].m_BufferImageGranularity = 0;
    pVVar7[1]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    pVVar7[1].m_Size = 0;
    *(undefined8 *)((long)&pVVar7[1].m_Size + 5) = 0;
    *(undefined8 *)((long)&pVVar7[1].m_pAllocationCallbacks + 5) = 0;
    *(undefined8 *)&pVVar7[7].m_IsVirtual = 0;
    pVVar7[8]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    *(undefined4 *)&pVVar7[8].m_Size = 0x10;
    pVVar7[8].m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    pVVar7[8].m_BufferImageGranularity = 0;
    *(undefined8 *)&pVVar7[8].m_IsVirtual = 0;
    pVVar7[9]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    pVVar7[9].m_Size = 0;
    pVVar7[9].m_pAllocationCallbacks = (VkAllocationCallbacks *)0x1;
    *(undefined4 *)&pVVar7[9].m_BufferImageGranularity = 0;
    *(undefined8 *)&pVVar7[9].m_IsVirtual = 0;
  }
  else {
    pVVar7 = (VmaBlockMetadata *)VmaMalloc(pAllocationCallbacks,0x90,8);
    pVVar7->m_Size = 0;
    pVVar7->m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    pVVar7->m_BufferImageGranularity = 1;
    pVVar7->m_IsVirtual = true;
    pVVar7->_vptr_VmaBlockMetadata = (_func_int **)&PTR__VmaBlockMetadata_Linear_0032ff30;
    pVVar7[1]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    pVVar7[1].m_Size = 0;
    pVVar7[1].m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    pVVar7[1].m_BufferImageGranularity = 0;
    *(undefined8 *)&pVVar7[1].m_IsVirtual = 0;
    pVVar7[2]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    pVVar7[2].m_Size = 0;
    pVVar7[2].m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    pVVar7[2].m_BufferImageGranularity = 0;
    *(undefined8 *)&pVVar7[2].m_IsVirtual = 0;
    pVVar7[3]._vptr_VmaBlockMetadata = (_func_int **)0x0;
    pVVar7[3].m_Size = 0;
    pVVar7[3].m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
  }
  this->m_Metadata = pVVar7;
  (*this->m_Metadata->_vptr_VmaBlockMetadata[2])(this->m_Metadata,createInfo->size);
  return;
}

Assistant:

VmaVirtualBlock_T::VmaVirtualBlock_T(const VmaVirtualBlockCreateInfo& createInfo)
    : m_AllocationCallbacksSpecified(createInfo.pAllocationCallbacks != VMA_NULL),
    m_AllocationCallbacks(createInfo.pAllocationCallbacks != VMA_NULL ? *createInfo.pAllocationCallbacks : VmaEmptyAllocationCallbacks)
{
    const uint32_t algorithm = createInfo.flags & VMA_VIRTUAL_BLOCK_CREATE_ALGORITHM_MASK;
    switch (algorithm)
    {
    default:
        VMA_ASSERT(0);
    case 0:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_TLSF)(VK_NULL_HANDLE, 1, true);
        break;
    case VMA_VIRTUAL_BLOCK_CREATE_LINEAR_ALGORITHM_BIT:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_Linear)(VK_NULL_HANDLE, 1, true);
        break;
    }

    m_Metadata->Init(createInfo.size);
}